

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void setReadOp(ReadOp *readOp,string *argument,bool *overrideFile,string *feature)

{
  bool bVar1;
  undefined1 local_48 [8];
  string operation;
  string *feature_local;
  bool *overrideFile_local;
  string *argument_local;
  ReadOp *readOp_local;
  
  operation.field_2._8_8_ = feature;
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_48,(ulong)argument);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_48,"suf");
  if (bVar1) {
    *readOp = BackupSuffix;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_48,"pre");
    if (bVar1) {
      *readOp = BackupPrefix;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48,"i");
      if (bVar1) {
        *readOp = InputFiles;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_48,"b");
        if (bVar1) {
          *overrideFile = false;
          *readOp = Unspecified;
        }
        else {
          std::__cxx11::string::operator=((string *)operation.field_2._8_8_,(string *)local_48);
          *readOp = Unspecified;
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void setReadOp(ReadOp &readOp, std::string &argument, bool &overrideFile, std::string &feature) {

    std::string operation = argument.substr(1, argument.size() - 1); // Remove the '-'

    if (operation == "suf") {
        readOp = BackupSuffix;
    } else if (operation == "pre") {
        readOp = BackupPrefix;
    } else if (operation == "i") {
        readOp = InputFiles;
    } else if (operation == "b") {
        overrideFile = false;
        readOp = Unspecified;
    } else {
        feature = operation;
        readOp = Unspecified;
    }
}